

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O0

void cfl_predict_hbd_avx2
               (int16_t *pred_buf_q3,uint16_t *dst,int dst_stride,int alpha_q3,int bd,int width,
               int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  __m256i max_00;
  __m256i max_01;
  __m256i zero;
  __m256i zero_00;
  __m256i u;
  __m256i u_00;
  __m256i dc_q0_00;
  __m256i dc_q0_01;
  __m256i alpha_sign_00;
  __m256i alpha_sign_01;
  __m256i alpha_q12_00;
  __m256i alpha_q12_01;
  ulong uVar4;
  ushort in_CX;
  int in_EDX;
  undefined8 *in_RSI;
  ulong in_RDI;
  int in_R9D;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  __m256i *palVar8;
  __m256i *input;
  longlong lVar9;
  longlong lVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  int in_stack_00000008;
  __m256i res_1;
  __m256i res;
  __m256i *row_end;
  __m256i *row;
  __m256i max;
  __m256i dc_q0;
  __m256i alpha_q12;
  __m256i alpha_sign;
  undefined8 in_stack_fffffffffffffd00;
  undefined8 *in_stack_fffffffffffffd08;
  undefined8 *puVar14;
  undefined6 in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  __m256i *in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  undefined8 in_stack_fffffffffffffd38;
  undefined8 uVar15;
  __m256i *palVar16;
  longlong lVar17;
  undefined8 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd60 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  longlong lVar20;
  undefined8 local_240;
  longlong lStack_230;
  undefined8 uStack_228;
  undefined8 *local_1d8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar1 = vpinsrw_avx(ZEXT216(in_CX),(uint)in_CX,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)in_CX,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)in_CX,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)in_CX,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)in_CX,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)in_CX,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)in_CX,7);
  auVar2 = vpinsrw_avx(ZEXT216(in_CX),(uint)in_CX,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)in_CX,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)in_CX,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)in_CX,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)in_CX,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)in_CX,6);
  auVar2 = vpinsrw_avx(auVar2,(uint)in_CX,7);
  auVar11 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  uStack_70 = auVar11._0_8_;
  uStack_68 = auVar11._8_8_;
  auVar3._16_8_ = uStack_70;
  auVar3._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auVar3._24_8_ = uStack_68;
  auVar3 = vpabsw_avx2(auVar3);
  auVar3 = vpsllw_avx2(auVar3,ZEXT416(9));
  uVar5 = *in_RSI;
  uVar7 = in_RSI[1];
  lVar9 = in_RSI[2];
  uVar12 = in_RSI[3];
  uVar18 = uVar5;
  uVar19 = uVar7;
  lVar20 = lVar9;
  highbd_max_epi16(in_stack_fffffffffffffd30);
  uVar4 = in_RDI + (long)(in_stack_00000008 << 1) * 0x20;
  local_1d8 = in_RSI;
  do {
    local_240 = auVar3._0_8_;
    input = auVar3._8_8_;
    lStack_230 = auVar3._16_8_;
    uStack_228 = auVar3._24_8_;
    alpha_q12_00[1] = uVar18;
    alpha_q12_00[0] = uVar12;
    alpha_q12_00[2] = uVar19;
    alpha_q12_00[3] = lVar20;
    alpha_sign_00[1] = uVar5;
    alpha_sign_00[0] = in_RDI;
    alpha_sign_00[2] = uVar7;
    alpha_sign_00[3] = lVar9;
    dc_q0_00[1] = in_stack_fffffffffffffd60._0_8_;
    dc_q0_00[2] = in_stack_fffffffffffffd60._8_8_;
    dc_q0_00[0] = in_stack_fffffffffffffd58;
    dc_q0_00[3] = uVar4;
    uVar6 = local_240;
    palVar8 = input;
    lVar10 = lStack_230;
    uVar13 = uStack_228;
    predict_unclipped(input,alpha_q12_00,alpha_sign_00,dc_q0_00);
    u[1] = uVar6;
    u[0] = in_stack_fffffffffffffd38;
    u[2] = (longlong)palVar8;
    u[3] = lVar10;
    zero[0]._6_2_ = in_CX;
    zero[0]._0_6_ = in_stack_fffffffffffffd18;
    zero[1] = in_stack_fffffffffffffd20;
    zero[2] = (longlong)in_stack_fffffffffffffd28;
    zero[3]._0_4_ = in_stack_fffffffffffffd30;
    zero[3]._4_4_ = in_stack_fffffffffffffd34;
    max_00[1] = in_stack_fffffffffffffd00;
    max_00[0] = 0x9a3ee7;
    max_00[2] = (longlong)in_stack_fffffffffffffd08;
    max_00[3] = (longlong)local_1d8;
    puVar14 = local_1d8;
    uVar15 = uVar6;
    palVar16 = palVar8;
    lVar17 = lVar10;
    in_stack_fffffffffffffd58 = uVar13;
    highbd_clamp_epi16(u,zero,max_00);
    *puVar14 = uVar6;
    puVar14[1] = palVar8;
    puVar14[2] = lVar10;
    puVar14[3] = uVar13;
    if (in_R9D == 0x20) {
      alpha_q12_01[1] = uVar18;
      alpha_q12_01[0] = uVar12;
      alpha_q12_01[2] = uVar19;
      alpha_q12_01[3] = lVar20;
      alpha_sign_01[1] = uVar5;
      alpha_sign_01[0] = in_RDI;
      alpha_sign_01[2] = uVar7;
      alpha_sign_01[3] = lVar9;
      dc_q0_01[1] = in_stack_fffffffffffffd60._0_8_;
      dc_q0_01[2] = in_stack_fffffffffffffd60._8_8_;
      dc_q0_01[0] = in_stack_fffffffffffffd58;
      dc_q0_01[3] = uVar4;
      predict_unclipped(input,alpha_q12_01,alpha_sign_01,dc_q0_01);
      in_stack_fffffffffffffd30 = (int)lStack_230;
      in_stack_fffffffffffffd34 = (undefined4)((ulong)lStack_230 >> 0x20);
      in_stack_fffffffffffffd08 = local_1d8 + 4;
      u_00[1] = uVar15;
      u_00[0] = uStack_228;
      u_00[2] = (longlong)palVar16;
      u_00[3] = lVar17;
      zero_00[0]._6_2_ = in_CX;
      zero_00[0]._0_6_ = in_stack_fffffffffffffd18;
      zero_00[1] = local_240;
      zero_00[2] = (longlong)input;
      zero_00[3]._0_4_ = in_stack_fffffffffffffd30;
      zero_00[3]._4_4_ = in_stack_fffffffffffffd34;
      max_01[1] = in_stack_fffffffffffffd00;
      max_01[0] = 0x9a3f8a;
      max_01[2] = (longlong)in_stack_fffffffffffffd08;
      max_01[3] = (longlong)puVar14;
      in_stack_fffffffffffffd20 = local_240;
      in_stack_fffffffffffffd28 = input;
      in_stack_fffffffffffffd38 = uStack_228;
      highbd_clamp_epi16(u_00,zero_00,max_01);
      *in_stack_fffffffffffffd08 = local_240;
      in_stack_fffffffffffffd08[1] = input;
      in_stack_fffffffffffffd08[2] = lStack_230;
      in_stack_fffffffffffffd08[3] = uStack_228;
    }
    local_1d8 = (undefined8 *)((long)local_1d8 + (long)in_EDX * 2);
    in_RDI = in_RDI + 0x40;
  } while (in_RDI < uVar4);
  return;
}

Assistant:

static inline void cfl_predict_hbd_avx2(const int16_t *pred_buf_q3,
                                        uint16_t *dst, int dst_stride,
                                        int alpha_q3, int bd, int width,
                                        int height) {
  // Use SSSE3 version for smaller widths
  assert(width == 16 || width == 32);
  const __m256i alpha_sign = _mm256_set1_epi16(alpha_q3);
  const __m256i alpha_q12 = _mm256_slli_epi16(_mm256_abs_epi16(alpha_sign), 9);
  const __m256i dc_q0 = _mm256_loadu_si256((__m256i *)dst);
  const __m256i max = highbd_max_epi16(bd);

  __m256i *row = (__m256i *)pred_buf_q3;
  const __m256i *row_end = row + height * CFL_BUF_LINE_I256;
  do {
    const __m256i res = predict_unclipped(row, alpha_q12, alpha_sign, dc_q0);
    _mm256_storeu_si256((__m256i *)dst,
                        highbd_clamp_epi16(res, _mm256_setzero_si256(), max));
    if (width == 32) {
      const __m256i res_1 =
          predict_unclipped(row + 1, alpha_q12, alpha_sign, dc_q0);
      _mm256_storeu_si256(
          (__m256i *)(dst + 16),
          highbd_clamp_epi16(res_1, _mm256_setzero_si256(), max));
    }
    dst += dst_stride;
  } while ((row += CFL_BUF_LINE_I256) < row_end);
}